

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetValueAndShowSection::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  bool bVar12;
  int iVar13;
  char *__s1;
  char *expected;
  string dump;
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_SetValueAndShowSection");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_f0,"foo");
  TVar1.length_ = local_d0.length_;
  TVar1.ptr_ = local_d0.ptr_;
  TVar1.is_immutable_ = local_d0.is_immutable_;
  TVar1._17_7_ = local_d0._17_7_;
  TVar1.id_ = local_d0.id_;
  TVar5.length_ = local_f0.length_;
  TVar5.ptr_ = local_f0.ptr_;
  TVar5.is_immutable_ = local_f0.is_immutable_;
  TVar5._17_7_ = local_f0._17_7_;
  TVar5.id_ = local_f0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar5);
  ctemplate::TemplateString::TemplateString(&local_110,"INSEC");
  ctemplate::TemplateString::TemplateString(&local_130,"bar");
  ctemplate::TemplateString::TemplateString(&local_150,"SEC1");
  TVar2.length_ = local_110.length_;
  TVar2.ptr_ = local_110.ptr_;
  TVar2.is_immutable_ = local_110.is_immutable_;
  TVar2._17_7_ = local_110._17_7_;
  TVar2.id_ = local_110.id_;
  TVar6.length_ = local_130.length_;
  TVar6.ptr_ = local_130.ptr_;
  TVar6.is_immutable_ = local_130.is_immutable_;
  TVar6._17_7_ = local_130._17_7_;
  TVar6.id_ = local_130.id_;
  TVar9.length_ = local_150.length_;
  TVar9.ptr_ = local_150.ptr_;
  TVar9.is_immutable_ = local_150.is_immutable_;
  TVar9._17_7_ = local_150._17_7_;
  TVar9.id_ = local_150.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar2,TVar6,TVar9);
  ctemplate::TemplateString::TemplateString(&local_170,"NOTINSEC");
  ctemplate::TemplateString::TemplateString(&local_190,"");
  ctemplate::TemplateString::TemplateString(&local_1b0,"SEC2");
  TVar3.length_ = local_170.length_;
  TVar3.ptr_ = local_170.ptr_;
  TVar3.is_immutable_ = local_170.is_immutable_;
  TVar3._17_7_ = local_170._17_7_;
  TVar3.id_ = local_170.id_;
  TVar7.length_ = local_190.length_;
  TVar7.ptr_ = local_190.ptr_;
  TVar7.is_immutable_ = local_190.is_immutable_;
  TVar7._17_7_ = local_190._17_7_;
  TVar7.id_ = local_190.id_;
  TVar10.length_ = local_1b0.length_;
  TVar10.ptr_ = local_1b0.ptr_;
  TVar10.is_immutable_ = local_1b0.is_immutable_;
  TVar10._17_7_ = local_1b0._17_7_;
  TVar10.id_ = local_1b0.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar3,TVar7,TVar10);
  ctemplate::TemplateString::TemplateString(&local_1d0,"NOTINSEC2");
  ctemplate::TemplateString::TemplateString(&local_1f0,(char *)0x0);
  ctemplate::TemplateString::TemplateString(&local_210,"SEC3");
  TVar4.length_ = local_1d0.length_;
  TVar4.ptr_ = local_1d0.ptr_;
  TVar4.is_immutable_ = local_1d0.is_immutable_;
  TVar4._17_7_ = local_1d0._17_7_;
  TVar4.id_ = local_1d0.id_;
  TVar8.length_ = local_1f0.length_;
  TVar8.ptr_ = local_1f0.ptr_;
  TVar8.is_immutable_ = local_1f0.is_immutable_;
  TVar8._17_7_ = local_1f0._17_7_;
  TVar8.id_ = local_1f0.id_;
  TVar11.length_ = local_210.length_;
  TVar11.ptr_ = local_210.ptr_;
  TVar11.is_immutable_ = local_210.is_immutable_;
  TVar11._17_7_ = local_210._17_7_;
  TVar11.id_ = local_210.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar4,TVar8,TVar11);
  ctemplate::TemplateString::TemplateString(&local_230,"SEC1");
  bVar12 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_230);
  if (bVar12) {
    fprintf(_stderr,"Check failed: %s\n","!(peer.IsHiddenSection(\"SEC1\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_250,"SEC2");
  bVar12 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_250);
  if (((bVar12 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.IsHiddenSection(\"SEC2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_270,"SEC3");
  bVar12 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_270);
  if (((bVar12 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.IsHiddenSection(\"SEC3\")");
    exit(1);
  }
  std::__cxx11::string::string((string *)&expected);
  ctemplate::TemplateDictionary::DumpToString((string *)local_78,(int)(string *)&expected);
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar13 = strcmp(__s1,
                  "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_SetValueAndShowSection\' {\n   TOPLEVEL: >foo<\n   section SEC1 (dict 1 of 1) -->\n     dictionary \'test_SetValueAndShowSection/SEC1#1\' {\n       INSEC: >bar<\n     }\n}\n"
                 );
  if (iVar13 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(dump.c_str(), expected) == 0");
    exit(1);
  }
  std::__cxx11::string::~string((string *)&expected);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
  return;
}

Assistant:

TEST(TemplateDictionary, SetValueAndShowSection) {
  TemplateDictionary dict("test_SetValueAndShowSection");
  TemplateDictionaryPeer peer(&dict);
  dict.SetValue("TOPLEVEL", "foo");

  dict.SetValueAndShowSection("INSEC", "bar", "SEC1");
  dict.SetValueAndShowSection("NOTINSEC", "", "SEC2");
  dict.SetValueAndShowSection("NOTINSEC2", NULL, "SEC3");

  EXPECT_FALSE(peer.IsHiddenSection("SEC1"));
  EXPECT_TRUE(peer.IsHiddenSection("SEC2"));
  EXPECT_TRUE(peer.IsHiddenSection("SEC3"));

  // Again, we don't get subdicts, so we have to dump to check values
  string dump;
  dict.DumpToString(&dump);
  const char* const expected =
    ("global dictionary {\n"
     "   BI_NEWLINE: >\n"
     "<\n"
     "   BI_SPACE: > <\n"
     "   GLOBAL: >top<\n"
     "};\n"
     "dictionary 'test_SetValueAndShowSection' {\n"
     "   TOPLEVEL: >foo<\n"
     "   section SEC1 (dict 1 of 1) -->\n"
     "     dictionary 'test_SetValueAndShowSection/SEC1#1' {\n"
     "       INSEC: >bar<\n"
     "     }\n"
     "}\n");
  EXPECT_STREQ(dump.c_str(), expected);
}